

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

void Gia_ManTestDoms2(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Vec_Int_t *vSupp;
  int *piVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  int level;
  long lVar11;
  timespec ts;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->vDoms != (Vec_Int_t *)0x0) {
    __assert_fail("p->vDoms == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                  ,0xc4,"void Gia_ManTestDoms2(Gia_Man_t *)");
  }
  Gia_ManComputeDoms(p);
  level = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar11 + lVar9) / 1000000.0);
  Gia_ManCleanMark1(p);
  pVVar8 = p->vCis;
  uVar10 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar10 <= lVar9) goto LAB_0061a22c;
      iVar6 = pVVar8->pArray[lVar9];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0061a20d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar2 = &p->pObjs[iVar6].field_0x7;
      *puVar2 = *puVar2 | 0x40;
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
      uVar10 = (ulong)pVVar8->nSize;
    } while (lVar9 < (long)(uVar10 - (long)p->nRegs));
  }
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar7 = (int *)malloc(400);
  vSupp->pArray = piVar7;
  Gia_ManCreateRefs(p);
  pVVar8 = p->vCis;
  uVar10 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar9 = 0;
LAB_0061a083:
    if ((int)uVar10 <= lVar9) {
LAB_0061a22c:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar3 = pVVar8->pArray[lVar9];
    lVar11 = (long)(int)uVar3;
    if ((lVar11 < 0) || (p->nObjs <= (int)uVar3)) {
LAB_0061a20d:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = p->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      if (p->vDoms->nSize <= (int)uVar3) goto LAB_0061a22c;
      uVar4 = p->vDoms->pArray[lVar11];
      if (uVar3 != uVar4) {
        if (((int)uVar4 < 0) || (p->nObjs <= (int)uVar4)) goto LAB_0061a20d;
        pGVar1 = pGVar5 + lVar11;
        pGVar5 = pGVar5 + uVar4;
        iVar6 = (int)*(ulong *)pGVar5;
        uVar10 = *(ulong *)pGVar5 & 0x1fffffff;
        if (uVar10 == 0x1fffffff || -1 < iVar6) {
          if ((iVar6 < 0) || ((int)uVar10 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pDom)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                          ,0xdd,"void Gia_ManTestDoms2(Gia_Man_t *)");
          }
          Abs_GiaObjDeref_rec(p,pGVar5);
          Abs_ManSupport2(p,pGVar5,vSupp);
          Abs_GiaObjRef_rec(p,pGVar5);
          pGVar5 = p->pObjs;
          if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (0 < (long)vSupp->nSize) {
            lVar11 = 0;
            do {
              if (vSupp->pArray[lVar11] ==
                  (int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555) goto LAB_0061a1ba;
              lVar11 = lVar11 + 1;
            } while (vSupp->nSize != lVar11);
          }
          puts("FAILURE.");
        }
        else if (pGVar5 + -uVar10 != pGVar1) {
          __assert_fail("Gia_ObjFanin0(pDom) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                        ,0xda,"void Gia_ManTestDoms2(Gia_Man_t *)");
        }
      }
LAB_0061a1ba:
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
      uVar10 = (ulong)pVVar8->nSize;
      if (lVar9 < (long)(uVar10 - (long)p->nRegs)) goto LAB_0061a083;
    }
  }
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
    vSupp->pArray = (int *)0x0;
  }
  free(vSupp);
  Gia_ManCleanMark1(p);
  return;
}

Assistant:

void Gia_ManTestDoms2( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj, * pDom;
    abctime clk = Abc_Clock();
    int i;
    assert( p->vDoms == NULL );
    Gia_ManComputeDoms( p );
/*
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjId(p, pObj) != Gia_ObjDom(p, pObj) )
            printf( "PI =%6d  Id =%8d. Dom =%8d.\n", i, Gia_ObjId(p, pObj), Gia_ObjDom(p, pObj) );
*/
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // for each dominated PI, when if the PIs is in a leaf of the MFFC of the dominator
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Gia_ObjId(p, pObj) == Gia_ObjDom(p, pObj) )
            continue;

        pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj));
        if ( Gia_ObjIsCo(pDom) )
        {
            assert( Gia_ObjFanin0(pDom) == pObj );
            continue;
        }
        assert( Gia_ObjIsAnd(pDom) );
        Abs_GiaObjDeref_rec( p, pDom );
        Abs_ManSupport2( p, pDom, vNodes );
        Abs_GiaObjRef_rec( p, pDom );

        if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) == -1 )
            printf( "FAILURE.\n" );
//        else
//            printf( "Success.\n" );
    }
    Vec_IntFree( vNodes );
    Gia_ManCleanMark1( p );
}